

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_as_json_stack_overflow(void)

{
  char cVar1;
  int __fd;
  void *__buf;
  ssize_t sVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  bson_t b;
  undefined1 auStack_180 [360];
  
  __buf = (void *)bson_malloc0(0x1100000);
  __fd = open("/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson//tests/binary/stackoverflow.bson"
              ,0);
  if (__fd == -1) {
    pcVar3 = "-1 != fd";
    uVar5 = 0x297;
  }
  else {
    sVar2 = read(__fd,__buf,0x1100000);
    if (sVar2 == 0x1000004) {
      cVar1 = bson_init_static(auStack_180,__buf,0x1000004);
      if (cVar1 == '\0') {
        pcVar3 = "r";
        uVar5 = 0x29d;
      }
      else {
        pcVar3 = (char *)bson_as_json(auStack_180,0);
        if (pcVar3 == (char *)0x0) {
          pcVar3 = "str";
          uVar5 = 0x2a0;
        }
        else {
          pcVar4 = strstr(pcVar3,"...");
          if (pcVar4 != (char *)0x0) {
            bson_free(pcVar3);
            bson_destroy(auStack_180);
            bson_free(__buf);
            return;
          }
          pcVar3 = "r";
          uVar5 = 0x2a3;
        }
      }
    }
    else {
      pcVar3 = "r == 16777220";
      uVar5 = 0x29a;
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar5,"test_bson_as_json_stack_overflow",pcVar3);
  abort();
}

Assistant:

static void
test_bson_as_json_stack_overflow (void)
{
   uint8_t *buf;
   bson_t b;
   size_t buflen = 1024 * 1024 * 17;
   char *str;
   int fd;
   ssize_t r;

   buf = bson_malloc0 (buflen);

   fd = bson_open (BINARY_DIR "/stackoverflow.bson", O_RDONLY);
   BSON_ASSERT (-1 != fd);

   r = bson_read (fd, buf, buflen);
   BSON_ASSERT (r == 16777220);

   r = bson_init_static (&b, buf, 16777220);
   BSON_ASSERT (r);

   str = bson_as_json (&b, NULL);
   BSON_ASSERT (str);

   r = !!strstr (str, "...");
   BSON_ASSERT (r);

   bson_free (str);
   bson_destroy (&b);
   bson_free (buf);
}